

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O3

void write_ivf_header(void *hal,RK_U8 *dst)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  undefined8 uVar6;
  
  lVar5 = *(long *)((long)hal + 0x70);
  uVar1 = *(undefined4 *)(lVar5 + 0xc);
  uVar2 = *(undefined4 *)(lVar5 + 0x10);
  uVar3 = *(undefined4 *)(lVar5 + 0xb8);
  uVar4 = *(undefined4 *)(lVar5 + 0xbc);
  uVar6 = *(undefined8 *)((long)hal + 0x6918);
  dst[0] = 'D';
  dst[1] = 'K';
  dst[2] = 'I';
  dst[3] = 'F';
  dst[4] = '\0';
  dst[5] = '\0';
  dst[6] = ' ';
  dst[7] = '\0';
  dst[8] = 'V';
  dst[9] = 'P';
  dst[10] = '8';
  dst[0xb] = '0';
  dst[0xc] = (RK_U8)uVar1;
  dst[0xd] = (RK_U8)((uint)uVar1 >> 8);
  dst[0xe] = (RK_U8)uVar2;
  dst[0xf] = (RK_U8)((uint)uVar2 >> 8);
  dst[0x10] = (RK_U8)uVar3;
  dst[0x11] = (RK_U8)((uint)uVar3 >> 8);
  dst[0x12] = (RK_U8)((uint)uVar3 >> 0x10);
  dst[0x13] = (RK_U8)((uint)uVar3 >> 0x18);
  dst[0x14] = (RK_U8)uVar4;
  dst[0x15] = (RK_U8)((uint)uVar4 >> 8);
  dst[0x16] = (RK_U8)((uint)uVar4 >> 0x10);
  dst[0x17] = (RK_U8)((uint)uVar4 >> 0x18);
  dst[0x18] = (RK_U8)uVar6;
  dst[0x19] = (RK_U8)((ulong)uVar6 >> 8);
  dst[0x1a] = (RK_U8)((ulong)uVar6 >> 0x10);
  dst[0x1b] = (RK_U8)((ulong)uVar6 >> 0x18);
  dst[0x1c] = '\0';
  dst[0x1d] = '\0';
  dst[0x1e] = '\0';
  dst[0x1f] = '\0';
  return;
}

Assistant:

static void write_ivf_header(VP8DParserContext_t *ctx, FILE *fp)
{
    RK_U8 data[IVF_HDR_BYTES] = {0};

    data[0] = 'D';
    data[1] = 'K';
    data[2] = 'I';
    data[3] = 'F';

    data[6] = 32;

    data[8] = 'V';
    data[9] = 'P';
    data[10] = '8';
    data[11] = '0';

    data[12] = ctx->width & 0xff;
    data[13] = (ctx->width >> 8) & 0xff;
    data[14] = ctx->height & 0xff;
    data[15] = (ctx->height >> 8) & 0xff;

    data[16] = 30;
    data[17] = data[18] = data[19] = 0;

    data[20] = 1;
    data[21] = data[22] = data[23] = 0;

    data[24] = data[25] = data[26] = data[27] = 0xff;

    fwrite(data, IVF_HDR_BYTES, 1, fp);
}